

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O1

void Dau_NetworkEnum(int nVars)

{
  Vec_Int_t *pVVar1;
  byte *pbVar2;
  void *pvVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *p;
  uint *pTable;
  long lVar6;
  byte bVar7;
  int Counter_2;
  uint uVar8;
  long lVar9;
  int Counter;
  uint uVar10;
  word wVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  word *pwVar15;
  int Counter_1;
  __time_t *p_Var16;
  timespec *ptVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  timespec ts_1;
  char pFileName [200];
  uint local_1fc;
  timespec local_1b0;
  word *local_1a0;
  int local_194;
  long local_190;
  ulong local_188;
  Vec_Int_t *local_180;
  ulong local_178;
  ulong local_170;
  long local_168;
  long local_160;
  long local_158;
  ulong local_150;
  long local_148;
  ulong local_140;
  ulong local_138;
  long local_130;
  timespec *local_128;
  ulong local_120;
  word *local_118;
  long local_110;
  long local_108;
  long local_100;
  timespec local_f8 [12];
  
  iVar4 = clock_gettime(3,local_f8);
  if (iVar4 < 0) {
    local_190 = -1;
  }
  else {
    local_190 = local_f8[0].tv_nsec / 1000 + local_f8[0].tv_sec * 1000000;
  }
  pVVar5 = (Vec_Int_t *)calloc(0x20,0x10);
  p = (Vec_Int_t *)calloc(0x20,0x10);
  uVar8 = nVars - 1;
  if (6 < uVar8) {
    __assert_fail("nBits >= 0 && nBits <= 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0xc2,"word Abc_Tt6Mask(int)");
  }
  uVar20 = 0xffffffffffffffff >> ((byte)(-1 << ((byte)uVar8 & 0x1f)) & 0x3f);
  uVar10 = 0;
  sprintf((char *)local_f8,"tableW%d.data");
  pTable = Dau_ReadFile((char *)local_f8,1 << ((char)(1 << ((byte)nVars & 0x1f)) - 2U & 0x1f));
  *(byte *)((long)pTable + 3) = *(byte *)((long)pTable + 3) | 0x80;
  iVar4 = (int)uVar20;
  pbVar2 = (byte *)((long)pTable + (uVar20 & 0xffffffff) * 4 + 3);
  *pbVar2 = *pbVar2 | 0x80;
  Vec_IntPush(pVVar5,0);
  Vec_IntPush(pVVar5,iVar4);
  Vec_IntPush(p,0);
  Vec_IntPush(p,iVar4);
  lVar6 = 4;
  do {
    uVar10 = uVar10 + *(int *)((long)&pVVar5->nCap + lVar6);
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x204);
  uVar20 = 0;
  lVar6 = 4;
  do {
    uVar20 = (ulong)(uint)((int)uVar20 + *(int *)((long)&p->nCap + lVar6));
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x204);
  local_180 = pVVar5;
  printf("Nodes = %2d.   New = %6d. Total = %6d.   New = %6d. Total = %6d.  ",0,
         (ulong)(uint)pVVar5->nSize,(ulong)uVar10,(ulong)(uint)p->nSize,uVar20);
  iVar13 = 3;
  iVar4 = clock_gettime(3,&local_1b0);
  if (iVar4 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_1b0.tv_nsec / 1000 + local_1b0.tv_sec * 1000000;
  }
  lVar6 = lVar6 - local_190;
  Abc_Print(iVar13,"%s =","Time");
  Abc_Print(iVar13,"%9.2f sec\n",(double)lVar6 / 1000000.0);
  local_194 = nVars + -6;
  local_128 = (timespec *)(&local_1b0.tv_sec + (1 << ((byte)(nVars + -6) & 0x1f)));
  local_120 = (ulong)(uint)nVars;
  local_150 = (ulong)uVar8;
  local_110 = local_150 * 8;
  local_118 = s_Truths6 + local_150;
  lVar6 = 1;
  do {
    local_168 = lVar6;
    pVVar5 = local_180 + lVar6;
    pVVar1 = p + lVar6;
    if (0 < local_180[lVar6 + -1].nSize) {
      lVar6 = 0;
      do {
        local_130 = lVar6;
        local_1b0.tv_sec = (long)pVVar5[-1].pArray[lVar6] << 0x20 | (long)pVVar5[-1].pArray[lVar6];
        if (nVars < 1) {
          local_1fc = 0;
        }
        else {
          uVar20 = 0;
          local_1fc = 0;
          do {
            if (nVars < 7) {
              bVar7 = (byte)(1 << ((byte)uVar20 & 0x1f));
LAB_00510f79:
              uVar10 = (uint)((s_Truths6Neg[uVar20] &
                              ((ulong)local_1b0.tv_sec >> (bVar7 & 0x3f) ^ local_1b0.tv_sec)) != 0);
            }
            else if (uVar20 < 6) {
              if (local_194 != 0x1f) {
                bVar7 = (byte)(1 << ((byte)uVar20 & 0x1f));
                goto LAB_00510f79;
              }
LAB_00510fb7:
              uVar10 = 0;
            }
            else {
              if (local_194 == 0x1f) goto LAB_00510fb7;
              bVar7 = (byte)(uVar20 - 6);
              uVar10 = 1 << (bVar7 & 0x1f);
              iVar4 = 2 << (bVar7 & 0x1f);
              uVar12 = 1;
              if (1 < (int)uVar10) {
                uVar12 = (ulong)uVar10;
              }
              p_Var16 = &local_1b0.tv_sec + (int)uVar10;
              ptVar17 = &local_1b0;
              do {
                if (uVar20 - 6 != 0x1f) {
                  uVar14 = 0;
                  do {
                    if ((&ptVar17->tv_sec)[uVar14] != p_Var16[uVar14]) {
                      uVar10 = 1;
                      goto LAB_00511027;
                    }
                    uVar14 = uVar14 + 1;
                  } while (uVar12 != uVar14);
                }
                ptVar17 = (timespec *)(&ptVar17->tv_sec + iVar4);
                p_Var16 = p_Var16 + iVar4;
                uVar10 = 0;
              } while (ptVar17 < local_128);
            }
LAB_00511027:
            local_1fc = local_1fc + uVar10;
            uVar20 = uVar20 + 1;
          } while (uVar20 != local_120);
        }
        if ((local_1fc != 6) &&
           ((s_Truths6Neg[(int)(uVar8 - local_1fc)] &
            ((ulong)local_1b0.tv_sec >> ((byte)(1 << ((byte)(uVar8 - local_1fc) & 0x1f)) & 0x3f) ^
            local_1b0.tv_sec)) != 0)) {
          __assert_fail("nSupp == 6 || !Abc_Tt6HasVar(uTruth, nVars-1-nSupp)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn.c"
                        ,0xd3,"void Dau_NetworkEnum(int)");
        }
        if (0 < (int)local_1fc) {
          local_160 = (long)(int)(uVar8 - local_1fc);
          local_178 = (ulong)local_1fc;
          local_148 = -(ulong)local_1fc;
          local_158 = 0;
          uVar20 = 0;
          do {
            pwVar15 = (word *)(local_150 - uVar20);
            if (5 < pwVar15) {
              __assert_fail("iVar >= 0 && iVar < 6",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                            ,0x337,"word Abc_Tt6Cofactor0(word, int)");
            }
            iVar4 = 1;
            bVar7 = (byte)(1 << ((byte)pwVar15 & 0x1f));
            uVar14 = (s_Truths6Neg[(long)pwVar15] & local_1b0.tv_sec) << (bVar7 & 0x3f) |
                     s_Truths6Neg[(long)pwVar15] & local_1b0.tv_sec;
            uVar12 = (local_1b0.tv_sec & s_Truths6[(long)pwVar15]) >> (bVar7 & 0x3f) |
                     local_1b0.tv_sec & s_Truths6[(long)pwVar15];
            local_1a0 = pwVar15;
            do {
              if ((int)local_1fc < nVars) {
                if (iVar4 == 1) {
                  uVar21 = s_Truths6[local_160] & s_Truths6[(long)pwVar15];
                  Dau_AddFunction(uVar14 & ~uVar21 | uVar21 & uVar12,nVars,pTable,pVVar5,pVVar1);
                  wVar11 = ~uVar21 & uVar12 | uVar21 & uVar14;
                }
                else {
                  wVar11 = (uVar12 ^ uVar14) & (s_Truths6[local_160] ^ s_Truths6[(long)pwVar15]) ^
                           uVar14;
                }
                Dau_AddFunction(wVar11,nVars,pTable,pVVar5,pVVar1);
                pwVar15 = local_1a0;
              }
              iVar4 = iVar4 + -1;
            } while (iVar4 == 0);
            local_140 = uVar20;
            iVar4 = 0;
            do {
              lVar6 = 0;
              do {
                if (uVar20 + lVar6 != 0) {
                  lVar9 = local_110 + lVar6 * 8;
                  if (iVar4 == 0) {
                    local_188 = s_Truths6[(long)pwVar15];
                    uVar20 = *(ulong *)((long)s_Truths6 + lVar9);
                    uVar21 = uVar20 & local_188;
                    Dau_AddFunction(uVar14 & ~uVar21 | uVar21 & uVar12,nVars,pTable,pVVar5,pVVar1);
                    Dau_AddFunction(~uVar21 & uVar12 | uVar21 & uVar14,nVars,pTable,pVVar5,pVVar1);
                    uVar20 = ~uVar20 & local_188;
                    Dau_AddFunction(uVar14 & ~uVar20 | uVar20 & uVar12,nVars,pTable,pVVar5,pVVar1);
                    wVar11 = ~uVar20 & uVar12 | uVar20 & uVar14;
                  }
                  else {
                    wVar11 = (uVar12 ^ uVar14) &
                             (*(ulong *)((long)s_Truths6 + lVar9) ^ s_Truths6[(long)pwVar15]) ^
                             uVar14;
                  }
                  Dau_AddFunction(wVar11,nVars,pTable,pVVar5,pVVar1);
                  pwVar15 = local_1a0;
                  uVar20 = local_140;
                }
                lVar6 = lVar6 + -1;
              } while (local_148 != lVar6);
              bVar22 = iVar4 == 0;
              iVar4 = iVar4 + 1;
            } while (bVar22);
            local_170 = 0;
            do {
              local_1a0 = local_118;
              uVar21 = 0;
              lVar6 = local_148;
              lVar9 = local_158;
              do {
                local_138 = uVar21 + 1;
                if ((uVar21 != uVar20) && (uVar21 + 1 < local_178)) {
                  local_188 = local_150 - uVar21;
                  lVar19 = -1;
                  local_100 = lVar6;
                  local_108 = lVar9;
                  do {
                    if (lVar9 != lVar19) {
                      if ((int)local_170 == 0) {
                        uVar20 = local_1a0[lVar19];
                        uVar21 = s_Truths6[local_188];
                        uVar18 = uVar21 & uVar20;
                        Dau_AddFunction(uVar14 & ~uVar18 | uVar18 & uVar12,nVars,pTable,pVVar5,
                                        pVVar1);
                        Dau_AddFunction(~uVar18 & uVar12 | uVar18 & uVar14,nVars,pTable,pVVar5,
                                        pVVar1);
                        uVar18 = ~uVar21 & uVar20;
                        Dau_AddFunction(uVar14 & ~uVar18 | uVar18 & uVar12,nVars,pTable,pVVar5,
                                        pVVar1);
                        Dau_AddFunction(~uVar18 & uVar12 | uVar18 & uVar14,nVars,pTable,pVVar5,
                                        pVVar1);
                        uVar18 = ~uVar20 & uVar21;
                        Dau_AddFunction(uVar14 & ~uVar18 | uVar18 & uVar12,nVars,pTable,pVVar5,
                                        pVVar1);
                        Dau_AddFunction(~uVar18 & uVar12 | uVar18 & uVar14,nVars,pTable,pVVar5,
                                        pVVar1);
                        uVar21 = uVar21 | uVar20;
                        Dau_AddFunction(uVar21 & uVar14 | uVar12 & ~uVar21,nVars,pTable,pVVar5,
                                        pVVar1);
                        wVar11 = uVar21 & uVar12 | ~uVar21 & uVar14;
                      }
                      else {
                        wVar11 = (uVar12 ^ uVar14) & (s_Truths6[local_188] ^ local_1a0[lVar19]) ^
                                 uVar14;
                      }
                      Dau_AddFunction(wVar11,nVars,pTable,pVVar5,pVVar1);
                      lVar6 = local_100;
                      lVar9 = local_108;
                    }
                    lVar19 = lVar19 + -1;
                  } while (lVar6 != lVar19);
                }
                local_1a0 = local_1a0 + -1;
                lVar9 = lVar9 + 1;
                lVar6 = lVar6 + 1;
                uVar21 = local_138;
                uVar20 = local_140;
              } while (local_138 != local_178);
              iVar4 = (int)local_170;
              local_170 = (ulong)(iVar4 + 1);
            } while (iVar4 == 0);
            uVar20 = local_140 + 1;
            local_158 = local_158 + -1;
          } while (uVar20 != local_178);
        }
        lVar6 = local_130 + 1;
      } while (lVar6 < pVVar5[-1].nSize);
    }
    uVar20 = 0;
    lVar6 = 4;
    do {
      uVar20 = (ulong)(uint)((int)uVar20 + *(int *)((long)&local_180->nCap + lVar6));
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x204);
    uVar12 = 0;
    lVar6 = 4;
    do {
      uVar12 = (ulong)(uint)((int)uVar12 + *(int *)((long)&p->nCap + lVar6));
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x204);
    printf("Nodes = %2d.   New = %6d. Total = %6d.   New = %6d. Total = %6d.  ",local_168,
           (ulong)(uint)pVVar5->nSize,uVar20,(ulong)(uint)pVVar1->nSize,uVar12);
    iVar13 = 3;
    iVar4 = clock_gettime(3,&local_1b0);
    if (iVar4 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_1b0.tv_nsec / 1000 + local_1b0.tv_sec * 1000000;
    }
    lVar6 = lVar6 - local_190;
    Abc_Print(iVar13,"%s =","Time");
    Abc_Print(iVar13,"%9.2f sec\n",(double)lVar6 / 1000000.0);
    fflush(_stdout);
    pVVar1 = local_180;
    if ((pVVar5->nSize == 0) || (lVar6 = local_168 + 1, lVar6 == 0x20)) {
      lVar6 = 8;
      do {
        pvVar3 = *(void **)((long)&pVVar1->nCap + lVar6);
        if (pvVar3 != (void *)0x0) {
          free(pvVar3);
          *(undefined8 *)((long)&pVVar1->nCap + lVar6) = 0;
        }
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x208);
      if (pVVar1 != (Vec_Int_t *)0x0) {
        free(pVVar1);
      }
      lVar6 = 8;
      do {
        pvVar3 = *(void **)((long)&p->nCap + lVar6);
        if (pvVar3 != (void *)0x0) {
          free(pvVar3);
          *(undefined8 *)((long)&p->nCap + lVar6) = 0;
        }
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x208);
      if (p != (Vec_Int_t *)0x0) {
        free(p);
      }
      free(pTable);
      iVar13 = 3;
      iVar4 = clock_gettime(3,&local_1b0);
      if (iVar4 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_1b0.tv_nsec / 1000 + local_1b0.tv_sec * 1000000;
      }
      lVar6 = lVar6 - local_190;
      Abc_Print(iVar13,"%s =","Total time");
      Abc_Print(iVar13,"%9.2f sec\n",(double)lVar6 / 1000000.0);
      fflush(_stdout);
      return;
    }
  } while( true );
}

Assistant:

void Dau_NetworkEnum(int nVars)
{
    abctime clk = Abc_Clock();
    int Limit = 2;
    int UseTwo = 0;
    int nSizeLog = (1<<nVars) -2;
    int nSizeW = 1 << nSizeLog;
    char pFileName[200];
    unsigned * pTable;
    Vec_Wec_t * vNpns  = Vec_WecStart( 32 );
    Vec_Wec_t * vNpns_ = Vec_WecStart( 32 );
    int i, v, u, g, k, m, n, Res, Entry;
    unsigned Inv = (unsigned)Abc_Tt6Mask(1 << (nVars-1));
    sprintf( pFileName, "tableW%d.data", nSizeLog );
    pTable  = Dau_ReadFile( pFileName, nSizeW );
    // create constant function and buffer/inverter function
    pTable[0]   |= (1 << 31);
    pTable[Inv] |= (1 << 31);
    Vec_IntPushTwo( Vec_WecEntry(vNpns,  0), 0, Inv );
    Vec_IntPushTwo( Vec_WecEntry(vNpns_, 0), 0, Inv );
    printf("Nodes = %2d.   New = %6d. Total = %6d.   New = %6d. Total = %6d.  ", 
        0, Vec_IntSize(Vec_WecEntry(vNpns,  0)), Vec_WecSizeSize(vNpns), 
           Vec_IntSize(Vec_WecEntry(vNpns_, 0)), Vec_WecSizeSize(vNpns_) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // numerate other functions based on how many nodes they have
    for ( n = 1; n < 32; n++ )
    {
        Vec_Int_t * vFuncsN2 = n > 1 ? Vec_WecEntry( vNpns, n-2 ) : NULL;
        Vec_Int_t * vFuncsN1 = Vec_WecEntry( vNpns, n-1 );
        Vec_Int_t * vFuncsN  = Vec_WecEntry( vNpns, n   );
        Vec_Int_t * vFuncsN_ = Vec_WecEntry( vNpns_,n   );
        Vec_IntForEachEntry( vFuncsN1, Entry, i )
        {
            word uTruth = (((word)Entry) << 32) | (word)Entry;
            int nSupp = Abc_TtSupportSize( &uTruth, nVars );
            assert( nSupp == 6 || !Abc_Tt6HasVar(uTruth, nVars-1-nSupp) );
            //printf( "Exploring function %4d with %d vars: ", i, nSupp );
            //printf( " %04x\n", (int)uTruth );
            //Dau_DsdPrintFromTruth( &uTruth, 4 );
            for ( v = 0; v < nSupp; v++ )
            {
                word tGate, tCur;
                word Cof0 = Abc_Tt6Cofactor0( uTruth, nVars-1-v );
                word Cof1 = Abc_Tt6Cofactor1( uTruth, nVars-1-v );
                for ( g = 0; g < Limit; g++ )
                {
                    if ( nSupp < nVars )
                    {
                        if ( g == 0 )
                        {
                            tGate = s_Truths6[nVars-1-v] & s_Truths6[nVars-1-nSupp];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                        else
                        {
                            tGate = s_Truths6[nVars-1-v] ^ s_Truths6[nVars-1-nSupp];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                    }
                }
                for ( g = 0; g < Limit; g++ )
                {
                    // add one cross bar
                    for ( k = 0; k < nSupp; k++ ) if ( k != v )
                    {
                        if ( g == 0 )
                        {
                            tGate = s_Truths6[nVars-1-v] & s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tGate = s_Truths6[nVars-1-v] & ~s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                        else
                        {
                            tGate = s_Truths6[nVars-1-v] ^ s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                    }
                }
                for ( g = 0; g < Limit; g++ )
                {
                    // add two cross bars
                    for ( k = 0;   k < nSupp; k++ ) if ( k != v )
                    for ( m = k+1; m < nSupp; m++ ) if ( m != v )
                    {
                        if ( g == 0 )
                        {
                            tGate = s_Truths6[nVars-1-m] & s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tGate = s_Truths6[nVars-1-m] & ~s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tGate = ~s_Truths6[nVars-1-m] & s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tGate = ~s_Truths6[nVars-1-m] & ~s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                        else
                        {
                            tGate = s_Truths6[nVars-1-m] ^ s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                    }
                }
            }
        }
        if ( UseTwo && vFuncsN2 )
        Vec_IntForEachEntry( vFuncsN2, Entry, i )
        {
            word uTruth = (((word)Entry) << 32) | (word)Entry;
            int nSupp = Abc_TtSupportSize( &uTruth, nVars );
            assert( nSupp == 6 || !Abc_Tt6HasVar(uTruth, nVars-1-nSupp) );
            //printf( "Exploring function %4d with %d vars: ", i, nSupp );
            //printf( " %04x\n", (int)uTruth );
            //Dau_DsdPrintFromTruth( &uTruth, 4 );
            for ( v = 0; v < nSupp; v++ )
//            for ( u = v+1; u < nSupp; u++ ) if ( u != v )
            for ( u = 0; u < nSupp; u++ ) if ( u != v )
            {
                word tGate1, tGate2, tCur;
                word Cof0 = Abc_Tt6Cofactor0( uTruth, nVars-1-v );
                word Cof1 = Abc_Tt6Cofactor1( uTruth, nVars-1-v );

                word Cof00 = Abc_Tt6Cofactor0( Cof0, nVars-1-u );
                word Cof01 = Abc_Tt6Cofactor1( Cof0, nVars-1-u );
                word Cof10 = Abc_Tt6Cofactor0( Cof1, nVars-1-u );
                word Cof11 = Abc_Tt6Cofactor1( Cof1, nVars-1-u );

                tGate1 = s_Truths6[nVars-1-v] & s_Truths6[nVars-1-u];
                tGate2 = s_Truths6[nVars-1-v] ^ s_Truths6[nVars-1-u];

                Cof0  = (tGate2 & Cof00) | (~tGate2 & Cof01);
                Cof1  = (tGate2 & Cof10) | (~tGate2 & Cof11);

                tCur  = (tGate1 & Cof1)  | (~tGate1 & Cof0);
                Res = Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                if ( Res )
                    printf( "Found function %d\n", Res );

                tCur  = (tGate1 & Cof0)  | (~tGate1 & Cof1);
                Res = Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                if ( Res )
                    printf( "Found function %d\n", Res );
            }
        }
        printf("Nodes = %2d.   New = %6d. Total = %6d.   New = %6d. Total = %6d.  ", 
            n, Vec_IntSize(vFuncsN), Vec_WecSizeSize(vNpns), Vec_IntSize(vFuncsN_), Vec_WecSizeSize(vNpns_) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        fflush(stdout);
        if ( Vec_IntSize(vFuncsN) == 0 )
            break;
    }
//    printf( "Functions with 7 nodes:\n" );
//    Vec_IntForEachEntry( Vec_WecEntry(vNpns_,7), Entry, i )
//        printf( "%04x ", Entry );
//    printf( "\n" );

    Vec_WecFree( vNpns );
    Vec_WecFree( vNpns_ );
    ABC_FREE( pTable );
    Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
    fflush(stdout);
}